

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemView::setRootIndex(QAbstractItemView *this,QModelIndex *index)

{
  long lVar1;
  QAbstractItemModel *pQVar2;
  char cVar3;
  long in_FS_OFFSET;
  code *local_50;
  undefined8 local_48;
  QAbstractItemView *local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  pQVar2 = (index->m).ptr;
  if ((pQVar2 == (QAbstractItemModel *)0x0 || (index->c | index->r) < 0) ||
     (pQVar2 == *(QAbstractItemModel **)(lVar1 + 0x2f8))) {
    QPersistentModelIndex::operator=((QPersistentModelIndex *)(lVar1 + 0x3b8),index);
    cVar3 = QAccessible::isActive();
    if (cVar3 != '\0') {
      local_38 = 0xffffffff;
      local_50 = QIcon::QIcon;
      local_30 = 0xffffffff;
      uStack_2c = 0xffffffff;
      uStack_28 = 0xffffffff;
      uStack_24 = 0xffffffff;
      local_48 = 0xaaaaaaaa00000116;
      local_40 = this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_50);
      QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
                ((QAccessibleTableModelChangeEvent *)&local_50);
    }
    if (*(char *)(lVar1 + 0x492) == '\0') {
      *(undefined1 *)(lVar1 + 0x492) = 1;
      QBasicTimer::start(lVar1 + 0x538,0,1,*(undefined8 *)(lVar1 + 8));
    }
    if ((*(int *)(lVar1 + 0x2ac) != 0) &&
       ((*(int *)(lVar1 + 0x2ac) == 2 || (*(char *)(lVar1 + 0x2a0) == '\0')))) {
      QWidget::updateGeometry(*(QWidget **)(lVar1 + 8));
    }
  }
  else {
    setRootIndex();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::setRootIndex(const QModelIndex &index)
{
    Q_D(QAbstractItemView);
    if (Q_UNLIKELY(index.isValid() && index.model() != d->model)) {
        qWarning("QAbstractItemView::setRootIndex failed : index must be from the currently set model");
        return;
    }
    d->root = index;
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(this, QAccessibleTableModelChangeEvent::ModelReset);
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
    d->doDelayedItemsLayout();
    d->updateGeometry();
}